

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O0

void rr::pa::TriangleStrip::
     exec<__gnu_cxx::__normal_iterator<rr::pa::Triangle*,std::vector<rr::pa::Triangle,std::allocator<rr::pa::Triangle>>>>
               (__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  reference pTVar1;
  int iVar2;
  __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
  local_90;
  Triangle local_88;
  __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
  local_68;
  Triangle local_60;
  ulong local_40;
  size_t ndx;
  VertexPacket *vert1;
  VertexPacket *vert0;
  size_t sStack_20;
  ProvokingVertex provokingConvention_local;
  size_t numVertices_local;
  VertexPacket **vertices_local;
  __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
  outputIterator_local;
  
  if (2 < numVertices) {
    vert1 = *vertices;
    ndx = (size_t)vertices[1];
    local_40 = 2;
    vert0._4_4_ = provokingConvention;
    sStack_20 = numVertices;
    numVertices_local = (size_t)vertices;
    vertices_local = &(outputIterator._M_current)->v0;
    for (; local_40 < sStack_20; local_40 = local_40 + 1) {
      iVar2 = 2;
      if (vert0._4_4_ == PROVOKINGVERTEX_FIRST) {
        iVar2 = 0;
      }
      Triangle::Triangle(&local_60,vert1,(VertexPacket *)ndx,
                         *(VertexPacket **)(numVertices_local + local_40 * 8),iVar2);
      local_68 = __gnu_cxx::
                 __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                 ::operator++((__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                               *)&vertices_local,0);
      pTVar1 = __gnu_cxx::
               __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
               ::operator*(&local_68);
      pTVar1->v0 = local_60.v0;
      pTVar1->v1 = local_60.v1;
      pTVar1->v2 = local_60.v2;
      pTVar1->provokingIndex = local_60.provokingIndex;
      vert1 = *(VertexPacket **)(numVertices_local + local_40 * 8);
      local_40 = local_40 + 1;
      if (sStack_20 <= local_40) {
        return;
      }
      iVar2 = 2;
      if (vert0._4_4_ == PROVOKINGVERTEX_FIRST) {
        iVar2 = 1;
      }
      Triangle::Triangle(&local_88,vert1,(VertexPacket *)ndx,
                         *(VertexPacket **)(numVertices_local + local_40 * 8),iVar2);
      local_90 = __gnu_cxx::
                 __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                 ::operator++((__normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
                               *)&vertices_local,0);
      pTVar1 = __gnu_cxx::
               __normal_iterator<rr::pa::Triangle_*,_std::vector<rr::pa::Triangle,_std::allocator<rr::pa::Triangle>_>_>
               ::operator*(&local_90);
      pTVar1->v0 = local_88.v0;
      pTVar1->v1 = local_88.v1;
      pTVar1->v2 = local_88.v2;
      pTVar1->provokingIndex = local_88.provokingIndex;
      ndx = *(size_t *)(numVertices_local + local_40 * 8);
    }
  }
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices < 3)
		{
		}
		else
		{
			VertexPacket* vert0 = vertices[0];
			VertexPacket* vert1 = vertices[1];
			size_t ndx = 2;

			for (;;)
			{
				{
					if (ndx >= numVertices)
						break;

					*(outputIterator++) = Triangle(vert0, vert1, vertices[ndx], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (2));
					vert0 = vertices[ndx];

					ndx++;
				}

				{
					if (ndx >= numVertices)
						break;

					*(outputIterator++) = Triangle(vert0, vert1, vertices[ndx], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (1) : (2));
					vert1 = vertices[ndx];

					ndx++;
				}
			}
		}
	}